

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcprrpacket.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPRRPacket::RTCPRRPacket(RTCPRRPacket *this,uint8_t *data,size_t datalength)

{
  byte bVar1;
  uint8_t padcount;
  size_t expectedlength;
  size_t len;
  RTCPCommonHeader *hdr;
  size_t datalength_local;
  uint8_t *data_local;
  RTCPRRPacket *this_local;
  
  RTCPPacket::RTCPPacket(&this->super_RTCPPacket,RR,data,datalength);
  (this->super_RTCPPacket)._vptr_RTCPPacket = (_func_int **)&PTR__RTCPRRPacket_001ad8f8;
  (this->super_RTCPPacket).knownformat = false;
  expectedlength = datalength;
  if ((*data >> 5 & 1) != 0) {
    bVar1 = data[datalength - 1];
    if ((bVar1 & 3) != 0) {
      return;
    }
    if (datalength <= bVar1) {
      return;
    }
    expectedlength = datalength - bVar1;
  }
  if ((long)(int)(uint)(*data & 0x1f) * 0x18 + 8U == expectedlength) {
    (this->super_RTCPPacket).knownformat = true;
  }
  return;
}

Assistant:

RTCPRRPacket::RTCPRRPacket(uint8_t *data,size_t datalength)
	: RTCPPacket(RR,data,datalength)
{
	knownformat = false;
	
	RTCPCommonHeader *hdr;
	size_t len = datalength;
	size_t expectedlength;
	
	hdr = (RTCPCommonHeader *)data;
	if (hdr->padding)
	{
		uint8_t padcount = data[datalength-1];
		if ((padcount & 0x03) != 0) // not a multiple of four! (see rfc 3550 p 37)
			return;
		if (((size_t)padcount) >= len)
			return;
		len -= (size_t)padcount;
	}

	expectedlength = sizeof(RTCPCommonHeader)+sizeof(uint32_t);
	expectedlength += sizeof(RTCPReceiverReport)*((int)hdr->count);

	if (expectedlength != len)
		return;
	
	knownformat = true;
}